

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiMultiplyMatrix4(aiMatrix4x4 *dst,aiMatrix4x4 *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  if (dst == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                  ,0x283,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
  }
  if (src != (aiMatrix4x4 *)0x0) {
    fVar1 = dst->a1;
    fVar2 = dst->a2;
    fVar3 = dst->a3;
    fVar4 = dst->a4;
    fVar5 = src->b1;
    fVar6 = src->a1;
    fVar7 = src->a2;
    fVar8 = src->c1;
    fVar9 = src->d1;
    fVar10 = src->b2;
    fVar11 = src->c2;
    fVar12 = src->d2;
    fVar13 = src->b3;
    fVar14 = src->a3;
    fVar15 = src->c3;
    fVar16 = src->d3;
    fVar17 = src->b4;
    fVar18 = src->a4;
    fVar19 = src->c4;
    fVar20 = src->d4;
    fVar21 = dst->b2;
    fVar22 = dst->b1;
    fVar23 = dst->b3;
    fVar24 = dst->b4;
    fVar25 = dst->c2;
    fVar26 = dst->c1;
    fVar27 = dst->c3;
    fVar28 = dst->c4;
    fVar29 = dst->d2;
    fVar30 = dst->d1;
    fVar31 = dst->d3;
    fVar32 = dst->d4;
    dst->a1 = fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar1 + fVar2 * fVar5;
    dst->a2 = fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar1 + fVar2 * fVar10;
    dst->a3 = fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar1 + fVar2 * fVar13;
    dst->a4 = fVar4 * fVar20 + fVar3 * fVar19 + fVar1 * fVar18 + fVar2 * fVar17;
    dst->b1 = fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5;
    dst->b2 = fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
    dst->b3 = fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
    dst->b4 = fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
    dst->c1 = fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5;
    dst->c2 = fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
    dst->c3 = fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
    dst->c4 = fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
    dst->d1 = fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29;
    dst->d2 = fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
    dst->d3 = fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
    dst->d4 = fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                ,0x284,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix4(
    aiMatrix4x4* dst,
    const aiMatrix4x4* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}